

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_writer::write_segment_header
          (jpeg_stream_writer *this,jpeg_marker_code marker_code,size_t data_size)

{
  size_t total_segment_size;
  size_t marker_code_size;
  size_t data_size_local;
  jpeg_marker_code marker_code_local;
  jpeg_stream_writer *this_local;
  
  if (0xfffd < data_size) {
    __assert_fail("data_size <= segment_max_data_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                  ,199,
                  "void charls::jpeg_stream_writer::write_segment_header(const jpeg_marker_code, const size_t)"
                 );
  }
  if (this->byte_offset_ + data_size + 4 <= (this->destination_).size) {
    write_marker(this,marker_code);
    write_uint16(this,(short)data_size + 2);
    return;
  }
  impl::throw_jpegls_error(UncompressedBufferTooSmall);
}

Assistant:

void jpeg_stream_writer::write_segment_header(const jpeg_marker_code marker_code, const size_t data_size)
{
    ASSERT(data_size <= segment_max_data_size);

    // Check if there is enough room in the destination to write the complete segment.
    // Other methods assume that the checking in done here and don't check again.
    constexpr size_t marker_code_size{2};
    const size_t total_segment_size{marker_code_size + segment_length_size + data_size};
    if (UNLIKELY(byte_offset_ + total_segment_size > destination_.size))
        impl::throw_jpegls_error(jpegls_errc::destination_buffer_too_small);

    write_marker(marker_code);
    write_uint16(static_cast<uint16_t>(segment_length_size + data_size));
}